

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3FkDropTable(Parse *pParse,SrcList *pName,Table *pTab)

{
  sqlite3 *db;
  uint p2;
  Vdbe *p;
  FKey *pFVar1;
  SrcList *pTabList;
  
  db = pParse->db;
  if ((((db->flags & 0x40000) != 0) && ((pTab->tabFlags & 0x10) == 0)) &&
     (pTab->pSelect == (Select *)0x0)) {
    p = sqlite3GetVdbe(pParse);
    pFVar1 = sqlite3FkReferences(pTab);
    p2 = 0;
    if (pFVar1 == (FKey *)0x0) {
      for (pFVar1 = pTab->pFKey; pFVar1 != (FKey *)0x0; pFVar1 = pFVar1->pNextFrom) {
        if (pFVar1->isDeferred != '\0') {
          p2 = sqlite3VdbeMakeLabel(p);
          sqlite3VdbeAddOp3(p,0x76,1,p2,0);
          goto LAB_0018af5c;
        }
      }
    }
    else {
LAB_0018af5c:
      pParse->disableTriggers = '\x01';
      pTabList = sqlite3SrcListDup(db,pName,0);
      sqlite3DeleteFrom(pParse,pTabList,(Expr *)0x0);
      pParse->disableTriggers = '\0';
      sqlite3VdbeAddOp3(p,0x76,0,p->nOp + 2,0);
      sqlite3HaltConstraint(pParse,0x313,2,"foreign key constraint failed",-2);
      if ((p2 != 0) && (p->aLabel != (int *)0x0)) {
        p->aLabel[(int)~p2] = p->nOp;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkDropTable(Parse *pParse, SrcList *pName, Table *pTab){
  sqlite3 *db = pParse->db;
  if( (db->flags&SQLITE_ForeignKeys) && !IsVirtual(pTab) && !pTab->pSelect ){
    int iSkip = 0;
    Vdbe *v = sqlite3GetVdbe(pParse);

    assert( v );                  /* VDBE has already been allocated */
    if( sqlite3FkReferences(pTab)==0 ){
      /* Search for a deferred foreign key constraint for which this table
      ** is the child table. If one cannot be found, return without 
      ** generating any VDBE code. If one can be found, then jump over
      ** the entire DELETE if there are no outstanding deferred constraints
      ** when this statement is run.  */
      FKey *p;
      for(p=pTab->pFKey; p; p=p->pNextFrom){
        if( p->isDeferred ) break;
      }
      if( !p ) return;
      iSkip = sqlite3VdbeMakeLabel(v);
      sqlite3VdbeAddOp2(v, OP_FkIfZero, 1, iSkip);
    }

    pParse->disableTriggers = 1;
    sqlite3DeleteFrom(pParse, sqlite3SrcListDup(db, pName, 0), 0);
    pParse->disableTriggers = 0;

    /* If the DELETE has generated immediate foreign key constraint 
    ** violations, halt the VDBE and return an error at this point, before
    ** any modifications to the schema are made. This is because statement
    ** transactions are not able to rollback schema changes.  */
    sqlite3VdbeAddOp2(v, OP_FkIfZero, 0, sqlite3VdbeCurrentAddr(v)+2);
    sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_FOREIGNKEY,
        OE_Abort, "foreign key constraint failed", P4_STATIC
    );

    if( iSkip ){
      sqlite3VdbeResolveLabel(v, iSkip);
    }
  }
}